

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::batch_normalize_conv
               (double eps,resizable_tensor *dest,resizable_tensor *means,resizable_tensor *invstds,
               double averaging_factor,resizable_tensor *running_means,
               resizable_tensor *running_variances,tensor *src,tensor *gamma,tensor *beta)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  undefined8 uVar6;
  longlong lVar7;
  longlong lVar8;
  long lVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar11;
  long lVar12;
  undefined4 extraout_var_03;
  long *in_RDX;
  resizable_tensor *in_RSI;
  long *in_RDI;
  long *in_R8;
  tensor *in_R9;
  float fVar13;
  double in_XMM0_Qa;
  tensor *item;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double in_XMM1_Qa;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  tensor *in_stack_00000008;
  tensor *in_stack_00000010;
  long i_1;
  long k_2;
  long n_1;
  float *p_dest;
  float actual_var;
  long k_1;
  double scale;
  float *rvar;
  long i;
  long k;
  long n;
  long num;
  float *p_src;
  float *p_beta;
  float *p_gamma;
  float *p_means;
  float *p_invstds;
  ostringstream dlib_o_out_3;
  ostringstream dlib_o_out_2;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  float in_stack_fffffffffffff53c;
  resizable_tensor *in_stack_fffffffffffff540;
  longlong in_stack_fffffffffffff548;
  string *in_stack_fffffffffffff550;
  matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *m;
  tensor *in_stack_fffffffffffff558;
  error_type eVar19;
  resizable_tensor *in_stack_fffffffffffff560;
  matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>_>
  *item_00;
  resizable_tensor *this;
  resizable_tensor *in_stack_fffffffffffff5e8;
  resizable_tensor *in_stack_fffffffffffff5f0;
  long local_758;
  long local_750;
  long local_748;
  float *local_740;
  matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *local_730;
  long local_718;
  resizable_tensor *local_710;
  matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>_>
  *local_708;
  float *local_6f8;
  ostringstream local_6a8 [383];
  undefined1 local_529;
  ostringstream local_508 [383];
  undefined1 local_389;
  ostringstream local_368 [383];
  undefined1 local_1e9;
  ostringstream local_1b8 [376];
  tensor *local_40;
  long *local_38;
  double local_28;
  long *local_20;
  resizable_tensor *local_18;
  long *local_10;
  double local_8;
  long lVar10;
  
  local_28 = in_XMM1_Qa;
  if ((in_XMM1_Qa < 0.0) || (1.0 < in_XMM1_Qa)) {
    dlib_assert_breakpoint();
    eVar19 = (error_type)((ulong)in_stack_fffffffffffff558 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar5 = std::operator<<((ostream *)local_1b8,"\n\nError detected at line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x420);
    std::operator<<(poVar5,".\n");
    poVar5 = std::operator<<((ostream *)local_1b8,"Error detected in file ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar5,".\n");
    poVar5 = std::operator<<((ostream *)local_1b8,"Error detected in function ");
    poVar5 = std::operator<<(poVar5,
                             "void dlib::cpu::batch_normalize_conv(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar5,".\n\n");
    poVar5 = std::operator<<((ostream *)local_1b8,"Failing expression was ");
    poVar5 = std::operator<<(poVar5,"0 <= averaging_factor && averaging_factor <= 1");
    std::operator<<(poVar5,".\n");
    poVar5 = (ostream *)std::ostream::operator<<(local_1b8,std::boolalpha);
    poVar5 = std::operator<<(poVar5,"averaging_factor: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_28);
    std::operator<<(poVar5,"\n");
    local_1e9 = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffff560,eVar19,in_stack_fffffffffffff550);
    local_1e9 = 0;
    __cxa_throw(uVar6,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  local_40 = in_R9;
  local_38 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_XMM0_Qa;
  if (((in_XMM1_Qa != 1.0) || (NAN(in_XMM1_Qa))) &&
     (bVar1 = have_same_dimensions
                        (&in_stack_fffffffffffff560->super_tensor,in_stack_fffffffffffff558), !bVar1
     )) {
    dlib_assert_breakpoint();
    eVar19 = (error_type)((ulong)in_stack_fffffffffffff558 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(local_368);
    poVar5 = std::operator<<((ostream *)local_368,"\n\nError detected at line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x421);
    std::operator<<(poVar5,".\n");
    poVar5 = std::operator<<((ostream *)local_368,"Error detected in file ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar5,".\n");
    poVar5 = std::operator<<((ostream *)local_368,"Error detected in function ");
    poVar5 = std::operator<<(poVar5,
                             "void dlib::cpu::batch_normalize_conv(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar5,".\n\n");
    poVar5 = std::operator<<((ostream *)local_368,"Failing expression was ");
    poVar5 = std::operator<<(poVar5,
                             "averaging_factor==1 || have_same_dimensions(running_means,means)");
    std::operator<<(poVar5,".\n");
    poVar5 = (ostream *)std::ostream::operator<<(local_368,std::boolalpha);
    poVar5 = std::operator<<(poVar5,"");
    std::operator<<(poVar5,"\n");
    local_389 = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffff560,eVar19,in_stack_fffffffffffff550);
    local_389 = 0;
    __cxa_throw(uVar6,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  if (((local_28 != 1.0) || (NAN(local_28))) &&
     (bVar1 = have_same_dimensions
                        (&in_stack_fffffffffffff560->super_tensor,in_stack_fffffffffffff558), !bVar1
     )) {
    dlib_assert_breakpoint();
    eVar19 = (error_type)((ulong)in_stack_fffffffffffff558 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(local_508);
    poVar5 = std::operator<<((ostream *)local_508,"\n\nError detected at line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x422);
    std::operator<<(poVar5,".\n");
    poVar5 = std::operator<<((ostream *)local_508,"Error detected in file ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar5,".\n");
    poVar5 = std::operator<<((ostream *)local_508,"Error detected in function ");
    poVar5 = std::operator<<(poVar5,
                             "void dlib::cpu::batch_normalize_conv(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar5,".\n\n");
    poVar5 = std::operator<<((ostream *)local_508,"Failing expression was ");
    poVar5 = std::operator<<(poVar5,
                             "averaging_factor==1 || have_same_dimensions(running_variances,invstds)"
                            );
    std::operator<<(poVar5,".\n");
    poVar5 = (ostream *)std::ostream::operator<<(local_508,std::boolalpha);
    poVar5 = std::operator<<(poVar5,"");
    std::operator<<(poVar5,"\n");
    local_529 = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffff560,eVar19,in_stack_fffffffffffff550);
    local_529 = 0;
    __cxa_throw(uVar6,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  lVar7 = tensor::num_samples(local_40);
  if (((1 < lVar7) && (lVar7 = tensor::num_samples(in_stack_00000008), lVar7 == 1)) &&
     ((lVar7 = tensor::num_samples(in_stack_00000010), lVar7 == 1 &&
      ((((lVar7 = tensor::nr(in_stack_00000008), lVar7 == 1 &&
         (lVar7 = tensor::nr(in_stack_00000010), lVar7 == 1)) &&
        (lVar7 = tensor::nc(in_stack_00000008), lVar7 == 1)) &&
       (lVar7 = tensor::nc(in_stack_00000010), lVar7 == 1)))))) {
    lVar7 = tensor::k(in_stack_00000008);
    lVar8 = tensor::k(in_stack_00000010);
    if (lVar7 == lVar8) {
      lVar7 = tensor::k(in_stack_00000010);
      lVar8 = tensor::k(local_40);
      if ((lVar7 == lVar8) && (0.0 < local_8)) {
        resizable_tensor::copy_size(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
        this = local_18;
        tensor::k(local_40);
        resizable_tensor::set_size
                  (in_stack_fffffffffffff560,(longlong)in_stack_fffffffffffff558,
                   (longlong)in_stack_fffffffffffff550,in_stack_fffffffffffff548,
                   (longlong)in_stack_fffffffffffff540);
        tensor::k(local_40);
        resizable_tensor::set_size
                  (in_stack_fffffffffffff560,(longlong)in_stack_fffffffffffff558,
                   (longlong)in_stack_fffffffffffff550,in_stack_fffffffffffff548,
                   (longlong)in_stack_fffffffffffff540);
        resizable_tensor::operator=(in_stack_fffffffffffff540,in_stack_fffffffffffff53c);
        resizable_tensor::operator=(in_stack_fffffffffffff540,in_stack_fffffffffffff53c);
        lVar9 = (**(code **)(*local_20 + 0x18))();
        iVar2 = (*(local_18->super_tensor)._vptr_tensor[3])();
        lVar10 = CONCAT44(extraout_var,iVar2);
        iVar2 = (*in_stack_00000008->_vptr_tensor[2])();
        iVar3 = (*in_stack_00000010->_vptr_tensor[2])();
        iVar4 = (*local_40->_vptr_tensor[2])();
        local_6f8 = (float *)CONCAT44(extraout_var_02,iVar4);
        lVar7 = tensor::nr(local_40);
        lVar8 = tensor::nc(local_40);
        lVar11 = lVar7 * lVar8;
        local_708 = (matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>_>
                     *)0x0;
        while (item_00 = local_708, lVar7 = tensor::num_samples(local_40), (long)item_00 < lVar7) {
          local_710 = (resizable_tensor *)0x0;
          while (in_stack_fffffffffffff560 = local_710, lVar7 = tensor::k(local_40),
                (long)in_stack_fffffffffffff560 < lVar7) {
            for (local_718 = 0; local_718 < lVar11; local_718 = local_718 + 1) {
              *(float *)(lVar10 + (long)local_710 * 4) =
                   *local_6f8 + *(float *)(lVar10 + (long)local_710 * 4);
              auVar16 = vfmadd213ss_fma(ZEXT416((uint)*local_6f8),ZEXT416((uint)*local_6f8),
                                        ZEXT416(*(uint *)(lVar9 + (long)local_710 * 4)));
              *(int *)(lVar9 + (long)local_710 * 4) = auVar16._0_4_;
              local_6f8 = local_6f8 + 1;
            }
            local_710 = (resizable_tensor *)((long)&(local_710->super_tensor)._vptr_tensor + 1);
          }
          local_708 = local_708 + 1;
        }
        tensor::num_samples(local_40);
        tensor::operator/=(&in_stack_fffffffffffff540->super_tensor,in_stack_fffffffffffff53c);
        tensor::num_samples(local_40);
        tensor::operator/=(&in_stack_fffffffffffff540->super_tensor,in_stack_fffffffffffff53c);
        (**(code **)(*local_20 + 0x18))();
        (*(local_18->super_tensor)._vptr_tensor[3])();
        (*local_40->_vptr_tensor[2])();
        resizable_tensor::copy_size(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
        lVar12 = (**(code **)(*local_38 + 0x18))();
        lVar7 = tensor::num_samples(local_40);
        item = (tensor *)(double)(lVar7 * lVar11);
        lVar7 = tensor::num_samples(local_40);
        dVar14 = (double)item / ((double)(lVar7 * lVar11) - 1.0);
        local_730 = (matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *)0x0;
        while (m = local_730, lVar7 = tensor::k(local_40), (long)m < lVar7) {
          auVar16 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar10 + (long)local_730 * 4)),
                                    ZEXT416(*(uint *)(lVar10 + (long)local_730 * 4) ^ 0x80000000),
                                    ZEXT416(*(uint *)(lVar9 + (long)local_730 * 4)));
          fVar13 = auVar16._0_4_;
          if ((local_28 != 1.0) || (NAN(local_28))) {
            auVar17._0_8_ = (double)*(float *)(lVar12 + (long)local_730 * 4);
            auVar17._8_8_ = 0;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = 1.0 - local_28;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = dVar14 * local_28 * (double)fVar13;
            auVar16 = vfmadd213sd_fma(auVar17,auVar16,auVar18);
            *(float *)(lVar12 + (long)local_730 * 4) = (float)auVar16._0_8_;
          }
          else {
            *(float *)(lVar12 + (long)local_730 * 4) = (float)(dVar14 * (double)fVar13);
          }
          dVar15 = sqrt((double)fVar13 + local_8);
          *(float *)(lVar9 + (long)local_730 * 4) = (float)(1.0 / dVar15);
          local_730 = local_730 + 1;
        }
        iVar4 = (*local_40->_vptr_tensor[2])();
        local_6f8 = (float *)CONCAT44(extraout_var_03,iVar4);
        local_740 = (float *)(**(code **)(*local_10 + 0x18))();
        local_748 = 0;
        while (lVar12 = local_748, lVar7 = tensor::num_samples(local_40), lVar12 < lVar7) {
          local_750 = 0;
          while (lVar12 = local_750, lVar7 = tensor::k(local_40), lVar12 < lVar7) {
            for (local_758 = 0; local_758 < lVar11; local_758 = local_758 + 1) {
              *local_740 = (*local_6f8 - *(float *)(lVar10 + local_750 * 4)) *
                           *(float *)(lVar9 + local_750 * 4);
              auVar16 = vfmadd213ss_fma(ZEXT416(*(uint *)(CONCAT44(extraout_var_00,iVar2) +
                                                         local_750 * 4)),ZEXT416((uint)*local_740),
                                        ZEXT416(*(uint *)(CONCAT44(extraout_var_01,iVar3) +
                                                         local_750 * 4)));
              *local_740 = auVar16._0_4_;
              local_6f8 = local_6f8 + 1;
              local_740 = local_740 + 1;
            }
            local_750 = local_750 + 1;
          }
          local_748 = local_748 + 1;
        }
        resizable_tensor::copy_size(in_stack_fffffffffffff560,item);
        if ((local_28 != 1.0) || (NAN(local_28))) {
          mat(item);
          dlib::operator*((double *)item,m);
          mat(item);
          dlib::operator*((double *)item,m);
          dlib::operator+((matrix_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
                           *)item,(matrix_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
                                   *)m);
          resizable_tensor::operator=(this,item_00);
        }
        else {
          resizable_tensor::operator=(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
        }
        return;
      }
    }
  }
  eVar19 = (error_type)((ulong)in_stack_fffffffffffff558 >> 0x20);
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream(local_6a8);
  poVar5 = std::operator<<((ostream *)local_6a8,"\n\nError detected at line ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x439);
  std::operator<<(poVar5,".\n");
  poVar5 = std::operator<<((ostream *)local_6a8,"Error detected in file ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                          );
  std::operator<<(poVar5,".\n");
  poVar5 = std::operator<<((ostream *)local_6a8,"Error detected in function ");
  poVar5 = std::operator<<(poVar5,
                           "void dlib::cpu::batch_normalize_conv(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                          );
  std::operator<<(poVar5,".\n\n");
  poVar5 = std::operator<<((ostream *)local_6a8,"Failing expression was ");
  poVar5 = std::operator<<(poVar5,
                           "src.num_samples() > 1 && gamma.num_samples() == 1 && beta.num_samples() == 1 && gamma.nr() == 1 && beta.nr() == 1 && gamma.nc() == 1 && beta.nc() == 1 && gamma.k() == beta.k() && beta.k() == src.k() && eps > 0"
                          );
  std::operator<<(poVar5,".\n");
  poVar5 = (ostream *)std::ostream::operator<<(local_6a8,std::boolalpha);
  poVar5 = std::operator<<(poVar5,"\ngamma.num_samples(): ");
  lVar7 = tensor::num_samples(in_stack_00000008);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar7);
  poVar5 = std::operator<<(poVar5,"\ngamma.k():  ");
  lVar7 = tensor::k(in_stack_00000008);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar7);
  poVar5 = std::operator<<(poVar5,"\ngamma.nr(): ");
  lVar7 = tensor::nr(in_stack_00000008);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar7);
  poVar5 = std::operator<<(poVar5,"\ngamma.nc(): ");
  lVar7 = tensor::nc(in_stack_00000008);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar7);
  poVar5 = std::operator<<(poVar5,"\nbeta.num_samples(): ");
  lVar7 = tensor::num_samples(in_stack_00000010);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar7);
  poVar5 = std::operator<<(poVar5,"\nbeta.k():   ");
  lVar7 = tensor::k(in_stack_00000010);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar7);
  poVar5 = std::operator<<(poVar5,"\nbeta.nr():  ");
  lVar7 = tensor::nr(in_stack_00000010);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar7);
  poVar5 = std::operator<<(poVar5,"\nbeta.nc():  ");
  lVar7 = tensor::nc(in_stack_00000010);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar7);
  poVar5 = std::operator<<(poVar5,"\nsrc.k():   ");
  lVar7 = tensor::k(local_40);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar7);
  poVar5 = std::operator<<(poVar5,"\nsrc.nr():  ");
  lVar7 = tensor::nr(local_40);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar7);
  poVar5 = std::operator<<(poVar5,"\nsrc.nc():  ");
  lVar7 = tensor::nc(local_40);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar7);
  poVar5 = std::operator<<(poVar5,"\neps:  ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_8);
  std::operator<<(poVar5,"\n");
  uVar6 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error
            ((fatal_error *)in_stack_fffffffffffff560,eVar19,in_stack_fffffffffffff550);
  __cxa_throw(uVar6,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void batch_normalize_conv (
            const double eps,
            resizable_tensor& dest,
            resizable_tensor& means,
            resizable_tensor& invstds,
            const double averaging_factor,
            resizable_tensor& running_means,
            resizable_tensor& running_variances,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta 
        )
        {
            DLIB_CASSERT(0 <= averaging_factor && averaging_factor <= 1, "averaging_factor: " << averaging_factor);
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_means,means));
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_variances,invstds));
            DLIB_CASSERT(
                src.num_samples() > 1 &&
                gamma.num_samples() == 1 && 
                beta.num_samples() == 1 && 
                gamma.nr() == 1 && 
                beta.nr() == 1 && 
                gamma.nc() == 1 && 
                beta.nc() == 1 && 
                gamma.k()  == beta.k()  && beta.k() == src.k() &&
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc()  <<
                "\neps:  " << eps 
            );

            dest.copy_size(src);
            means.set_size(1, src.k());
            invstds.set_size(1, src.k());

            // first compute means and invstds
            means = 0;
            invstds = 0;
            const auto p_invstds = invstds.host();
            const auto p_means = means.host();
            const auto p_gamma = gamma.host();   
            const auto p_beta = beta.host();   
            auto p_src = src.host();
            const long num = src.nr()*src.nc();
            // compute means, and sum of squares
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < src.k(); ++k)
                {
                    for (long i = 0; i < num; ++i)
                    {
                        p_means[k] += *p_src;
                        p_invstds[k] += (*p_src)*(*p_src);
                        ++p_src;
                    }
                }
            }
            means /= src.num_samples()*num;
            invstds /= src.num_samples()*num;
            // copy data back to host
            invstds.host(); means.host();

            p_src = src.host();
            // compute variances 
            running_variances.copy_size(invstds);
            auto rvar = running_variances.host();
            // This scale makes the running variances unbiased.
            const double scale = (src.num_samples()*num)/(src.num_samples()*num-1.0);
            for (long k = 0; k < src.k(); ++k)
            {
                float actual_var = p_invstds[k] - p_means[k]*p_means[k];
                if (averaging_factor == 1)
                    rvar[k] = scale*actual_var;
                else
                    rvar[k] = (1-averaging_factor)*rvar[k] + scale*averaging_factor*actual_var;

                p_invstds[k] = 1.0f/std::sqrt(actual_var + eps);
            }

            p_src = src.host();
            auto p_dest = dest.host();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < src.k(); ++k)
                {
                    for (long i = 0; i < num; ++i)
                    {
                        *p_dest = (*p_src - p_means[k])*p_invstds[k];
                        *p_dest = (*p_dest)*p_gamma[k] + p_beta[k];
                        ++p_src;
                        ++p_dest;
                    }
                }
            }

            // now keep track of the running means 
            running_means.copy_size(means);
            if (averaging_factor != 1)
                running_means = (1-averaging_factor)*mat(running_means) + averaging_factor*mat(means);
            else
                running_means = means;
        }